

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SurfaceCurvature __thiscall
ON_SubDMeshFragment::CornerCurvature(ON_SubDMeshFragment *this,uint grid_corner_index)

{
  uint uVar1;
  ON_SurfaceCurvature OVar2;
  uint uVar3;
  uint i;
  uint n;
  uint grid_corner_index_local;
  ON_SubDMeshFragment *this_local;
  double local_10;
  
  if ((grid_corner_index < 4) && ((this->m_grid).m_S != (uint *)0x0)) {
    uVar3 = CurvatureCount(this);
    uVar1 = (this->m_grid).m_S[grid_corner_index * (this->m_grid).m_side_segment_count];
    if (uVar1 < uVar3) {
      this_local = (ON_SubDMeshFragment *)this->m_K[uVar1].k1;
      local_10 = this->m_K[uVar1].k2;
      goto LAB_008dd6a0;
    }
  }
  this_local = (ON_SubDMeshFragment *)ON_SurfaceCurvature::Nan.k1;
  local_10 = ON_SurfaceCurvature::Nan.k2;
LAB_008dd6a0:
  OVar2.k2 = local_10;
  OVar2.k1 = (double)this_local;
  return OVar2;
}

Assistant:

const ON_SurfaceCurvature ON_SubDMeshFragment::CornerCurvature(unsigned int grid_corner_index) const
{
  for (;;)
  {
    if (grid_corner_index >= 4 || nullptr == m_grid.m_S)
      break;

    const unsigned n = this->CurvatureCount();
    const unsigned int i = m_grid.m_S[grid_corner_index * m_grid.m_side_segment_count];
    if (i >= n)
      break;

    return m_K[i];
  }
  return ON_SurfaceCurvature::Nan;
}